

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::
TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this,TPZCompMesh *cmesh)

{
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    field_0x160 = 0x19e0318;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x19e03e0;
  *(undefined4 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    field_0x168 = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  field_0x16c = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__019ddfe0,cmesh);
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x19dfd08;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    field_0x160 = 0x19dfde8;
  TPZStructMatrixOT<std::complex<double>_>::TPZStructMatrixOT
            ((TPZStructMatrixOT<std::complex<double>_> *)
             &(this->
              super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019de008);
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations.fStore = (long *)0x0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations.fNElements = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fActiveEquations.fNAlloc = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination.fStore = (long *)0x0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination.fNElements = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  fEquationDestination.fNAlloc = 0;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x19ddd88;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    field_0x160 = 0x19ddf58;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0 = 0x19dde50;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZCompMesh *cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}